

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ
          (char *lhs_expression,char *rhs_expression,BiggestInt lhs,BiggestInt rhs)

{
  long in_RCX;
  longlong *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  long in_R8;
  AssertionResult AVar2;
  bool in_stack_0000002f;
  string *in_stack_00000030;
  string *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  longlong *value;
  string local_68 [32];
  string local_48 [32];
  longlong local_28 [5];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (in_RCX == in_R8) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    value = local_28;
    FormatForComparisonFailureMessage<long_long,long_long>(value,in_RDX);
    FormatForComparisonFailureMessage<long_long,long_long>(value,in_RDX);
    EqFailure(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
              in_stack_0000002f);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            BiggestInt lhs,
                            BiggestInt rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}